

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::findOrInsert<QByteArray>
          (InsertionResult *__return_storage_ptr__,
          Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *this,QByteArray *key)

{
  Span *pSVar1;
  bool bVar2;
  size_t hash;
  QByteArrayView QVar3;
  Bucket BVar4;
  
  QVar3.m_data = (key->d).ptr;
  QVar3.m_size = (key->d).size;
  hash = qHash(QVar3,this->seed);
  if (this->numBuckets == 0) {
    BVar4 = (Bucket)ZEXT816(0);
  }
  else {
    BVar4 = findBucketWithHash<QByteArray>(this,key,hash);
    bVar2 = true;
    if ((BVar4.span)->offsets[BVar4.index] != 0xff) goto LAB_001132f7;
  }
  if (this->numBuckets >> 1 <= this->size) {
    rehash(this,this->size + 1);
    BVar4 = findBucketWithHash<QByteArray>(this,key,hash);
  }
  Span<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::insert(BVar4.span,BVar4.index);
  this->size = this->size + 1;
  bVar2 = false;
LAB_001132f7:
  pSVar1 = this->spans;
  (__return_storage_ptr__->it).d = this;
  (__return_storage_ptr__->it).bucket =
       ((ulong)((long)BVar4.span - (long)pSVar1) >> 4) * 0x1c71c71c71c71c80 | BVar4.index;
  __return_storage_ptr__->initialized = bVar2;
  return __return_storage_ptr__;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }